

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O0

void __thiscall
iu_MatcherFailure_x_iutest_x_NanSensitiveFloatEq_Test::Body
          (iu_MatcherFailure_x_iutest_x_NanSensitiveFloatEq_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionHelper local_3f0;
  Fixed local_3c0;
  anon_class_1_0_00000001 local_231;
  undefined1 local_230 [8];
  AssertionResult iutest_spi_ar_1;
  Fixed local_1d8;
  anon_class_1_0_00000001 local_39;
  undefined1 local_38 [8];
  AssertionResult iutest_spi_ar;
  iu_MatcherFailure_x_iutest_x_NanSensitiveFloatEq_Test *this_local;
  
  iutest_spi_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  Body::anon_class_1_0_00000001::operator()((AssertionResult *)local_38,&local_39);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_1d8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1d8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_38);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_1.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x1f8,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_1.m_result,&local_1d8);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_1.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1d8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  iutest::detail::AlwaysZero();
  Body::anon_class_1_0_00000001::operator()((AssertionResult *)local_230,&local_231);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar1) {
    memset(&local_3c0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_3c0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_230);
    iutest::AssertionHelper::AssertionHelper
              (&local_3f0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x1f9,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_3f0,&local_3c0);
    iutest::AssertionHelper::~AssertionHelper(&local_3f0);
    iutest::AssertionHelper::Fixed::~Fixed(&local_3c0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  return;
}

Assistant:

IUTEST(MatcherFailure, NanSensitiveFloatEq)
{
    CHECK_FAILURE( IUTEST_ASSERT_THAT(f0, NanSensitiveFloatEq(1.0f)), "Eq: " );
    CHECK_FAILURE( IUTEST_ASSERT_THAT(f0, NanSensitiveFloatingPointEq(1.0f)), "Eq: " );
}